

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall TestValueTestarrays::runTestCase(TestValueTestarrays *this)

{
  Value *value;
  TestResult *pTVar1;
  bool bVar2;
  ValueType actual;
  Value *pVVar3;
  Value got;
  IsCheck checks;
  ValueHolder local_2c0;
  char *local_2b8;
  undefined4 local_2b0;
  char *local_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  Value local_290;
  Value local_268;
  Value local_240;
  Value local_218;
  Value local_1f0;
  Value local_1c8;
  Value local_1a0;
  Value local_178;
  Value local_150;
  Value local_128;
  Value local_100;
  Value local_d8;
  Value local_b0;
  Value local_88;
  Value local_60;
  IsCheck local_38;
  
  local_38.isUInt64_ = false;
  local_38.isIntegral_ = false;
  local_38.isDouble_ = false;
  local_38.isNumeric_ = false;
  local_38.isObject_ = false;
  local_38.isArray_ = true;
  local_38.isBool_ = false;
  local_38.isString_ = false;
  local_38.isNull_ = false;
  local_38.isInt_ = false;
  local_38.isInt64_ = false;
  local_38.isUInt_ = false;
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_2c0.int_._0_4_ = pTVar1->predicateId_;
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_2b0 = 0xdd;
  local_2a8 = "checkIs(emptyArray_, checks)";
  local_2a0 = 0;
  uStack_298 = 0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)&local_2c0;
  pTVar1->predicateId_ = local_2c0.int_._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)&local_2c0;
  pVVar3 = &(this->super_ValueTest).emptyArray_;
  ValueTest::checkIs(&this->super_ValueTest,pVVar3,&local_38);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_2c0.int_._0_4_ = pTVar1->predicateId_;
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_2b0 = 0xde;
  local_2a8 = "checkIs(array1_, checks)";
  local_2a0 = 0;
  uStack_298 = 0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)&local_2c0;
  pTVar1->predicateId_ = local_2c0.int_._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)&local_2c0;
  value = &(this->super_ValueTest).array1_;
  ValueTest::checkIs(&this->super_ValueTest,value,&local_38);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  actual = Json::Value::type(value);
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            (pTVar1,arrayValue,actual,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0xe0,"Json::arrayValue == array1_.type()");
  bVar2 = Json::Value::isConvertibleTo(pVVar3,nullValue);
  if (!bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0xe3,"emptyArray_.isConvertibleTo(Json::nullValue)");
  }
  bVar2 = Json::Value::isConvertibleTo(value,nullValue);
  if (bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0xe6,"!array1_.isConvertibleTo(Json::nullValue)");
  }
  bVar2 = Json::Value::isConvertibleTo(pVVar3,arrayValue);
  if (!bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0xe9,"emptyArray_.isConvertibleTo(Json::arrayValue)");
  }
  bVar2 = Json::Value::isConvertibleTo(pVVar3,objectValue);
  if (bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0xec,"!emptyArray_.isConvertibleTo(Json::objectValue)");
  }
  bVar2 = Json::Value::isConvertibleTo(pVVar3,intValue);
  if (bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0xed,"!emptyArray_.isConvertibleTo(Json::intValue)");
  }
  bVar2 = Json::Value::isConvertibleTo(pVVar3,uintValue);
  if (bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0xee,"!emptyArray_.isConvertibleTo(Json::uintValue)");
  }
  bVar2 = Json::Value::isConvertibleTo(pVVar3,realValue);
  if (bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0xef,"!emptyArray_.isConvertibleTo(Json::realValue)");
  }
  bVar2 = Json::Value::isConvertibleTo(pVVar3,booleanValue);
  if (bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0xf0,"!emptyArray_.isConvertibleTo(Json::booleanValue)");
  }
  bVar2 = Json::Value::isConvertibleTo(pVVar3,stringValue);
  if (bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0xf1,"!emptyArray_.isConvertibleTo(Json::stringValue)");
  }
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::Value(&local_60,0x4d2);
  pVVar3 = Json::Value::operator[](value,0);
  Json::Value::Value(&local_88,pVVar3);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (pTVar1,&local_60,&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0xf5,"Json::Value(1234) == constArray[index0]");
  Json::Value::~Value(&local_88);
  Json::Value::~Value(&local_60);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::Value(&local_b0,0x4d2);
  pVVar3 = Json::Value::operator[](value,0);
  Json::Value::Value(&local_d8,pVVar3);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (pTVar1,&local_b0,&local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0xf6,"Json::Value(1234) == constArray[0]");
  Json::Value::~Value(&local_d8);
  Json::Value::~Value(&local_b0);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::Value(&local_100,0x4d2);
  pVVar3 = Json::Value::operator[](value,0);
  Json::Value::Value(&local_128,pVVar3);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (pTVar1,&local_100,&local_128,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0xf9,"Json::Value(1234) == array1_[index0]");
  Json::Value::~Value(&local_128);
  Json::Value::~Value(&local_100);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::Value(&local_150,0x4d2);
  pVVar3 = Json::Value::operator[](value,0);
  Json::Value::Value(&local_178,pVVar3);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (pTVar1,&local_150,&local_178,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0xfa,"Json::Value(1234) == array1_[0]");
  Json::Value::~Value(&local_178);
  Json::Value::~Value(&local_150);
  Json::Value::Value(&local_1a0,0x11);
  pVVar3 = Json::Value::operator[](value,2);
  Json::Value::operator=(pVVar3,&local_1a0);
  Json::Value::~Value(&local_1a0);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::Value(&local_1c8,nullValue);
  pVVar3 = Json::Value::operator[](value,1);
  Json::Value::Value(&local_1f0,pVVar3);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (pTVar1,&local_1c8,&local_1f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0xfd,"Json::Value() == array1_[1]");
  Json::Value::~Value(&local_1f0);
  Json::Value::~Value(&local_1c8);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::Value(&local_218,0x11);
  pVVar3 = Json::Value::operator[](value,2);
  Json::Value::Value(&local_240,pVVar3);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (pTVar1,&local_218,&local_240,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0xfe,"Json::Value(17) == array1_[2]");
  Json::Value::~Value(&local_240);
  Json::Value::~Value(&local_218);
  Json::Value::Value((Value *)&local_2c0,nullValue);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  bVar2 = Json::Value::removeIndex(value,2,(Value *)&local_2c0);
  JsonTest::checkEqual<bool,bool>
            (pTVar1,true,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x100,"true == array1_.removeIndex(2, &got)");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::Value(&local_268,0x11);
  Json::Value::Value(&local_290,(Value *)&local_2c0);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (pTVar1,&local_268,&local_290,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x101,"Json::Value(17) == got");
  Json::Value::~Value(&local_290);
  Json::Value::~Value(&local_268);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  bVar2 = Json::Value::removeIndex(value,2,(Value *)&local_2c0);
  JsonTest::checkEqual<bool,bool>
            (pTVar1,false,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x102,"false == array1_.removeIndex(2, &got)");
  Json::Value::~Value((Value *)&local_2c0);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, arrays) {
  const unsigned int index0 = 0;

  // Types
  IsCheck checks;
  checks.isArray_ = true;
  JSONTEST_ASSERT_PRED(checkIs(emptyArray_, checks));
  JSONTEST_ASSERT_PRED(checkIs(array1_, checks));

  JSONTEST_ASSERT_EQUAL(Json::arrayValue, array1_.type());

  // Empty array okay
  JSONTEST_ASSERT(emptyArray_.isConvertibleTo(Json::nullValue));

  // Non-empty array not okay
  JSONTEST_ASSERT(!array1_.isConvertibleTo(Json::nullValue));

  // Always okay
  JSONTEST_ASSERT(emptyArray_.isConvertibleTo(Json::arrayValue));

  // Never okay
  JSONTEST_ASSERT(!emptyArray_.isConvertibleTo(Json::objectValue));
  JSONTEST_ASSERT(!emptyArray_.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(!emptyArray_.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(!emptyArray_.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(!emptyArray_.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(!emptyArray_.isConvertibleTo(Json::stringValue));

  // Access through const reference
  const Json::Value& constArray = array1_;
  JSONTEST_ASSERT_EQUAL(Json::Value(1234), constArray[index0]);
  JSONTEST_ASSERT_EQUAL(Json::Value(1234), constArray[0]);

  // Access through non-const reference
  JSONTEST_ASSERT_EQUAL(Json::Value(1234), array1_[index0]);
  JSONTEST_ASSERT_EQUAL(Json::Value(1234), array1_[0]);

  array1_[2] = Json::Value(17);
  JSONTEST_ASSERT_EQUAL(Json::Value(), array1_[1]);
  JSONTEST_ASSERT_EQUAL(Json::Value(17), array1_[2]);
  Json::Value got;
  JSONTEST_ASSERT_EQUAL(true, array1_.removeIndex(2, &got));
  JSONTEST_ASSERT_EQUAL(Json::Value(17), got);
  JSONTEST_ASSERT_EQUAL(false, array1_.removeIndex(2, &got)); // gone now
}